

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flechette.cpp
# Opt level: O3

int AF_A_PoisonBagCheck(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  FState *newstate;
  uint uVar6;
  AActor *this;
  VMValue *pVVar7;
  char *__assertion;
  bool bVar8;
  bool bVar9;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005de798;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this == (AActor *)0x0) {
LAB_005de67c:
        this = (AActor *)0x0;
        pVVar7 = param;
        uVar6 = numparam;
      }
      else {
        pPVar5 = (this->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (this->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar8 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar8;
        bVar9 = pPVar5 == pPVar3;
        if (!bVar9 && !bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
        uVar6 = (uint)bVar8;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005de798;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005de734;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005de788;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar6,ret);
              puVar2[1] = pPVar5;
            }
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar8) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar8 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar8) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005de798;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005de788;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005de734:
        iVar4 = this->special1;
        this->special1 = iVar4 + -1;
        if (iVar4 < 2) {
          local_2c.Index = FName::NameManager::FindName(&FName::NameData,"Death",false);
          newstate = AActor::FindState(this,&local_2c);
          AActor::SetState(this,newstate,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005de798;
    }
    if (this == (AActor *)0x0) goto LAB_005de67c;
  }
LAB_005de788:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005de798:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                ,0x181,"int AF_A_PoisonBagCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PoisonBagCheck)
{
	PARAM_ACTION_PROLOGUE;

	if (--self->special1 <= 0)
	{
		self->SetState (self->FindState ("Death"));
	}
	else
	{
		return 0;
	}
	return 0;
}